

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O0

bool __thiscall
cfd::TransactionContext::VerifyInputSchnorrSignature
          (TransactionContext *this,SchnorrSignature *signature,OutPoint *outpoint,
          vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *utxo_list,SchnorrPubkey *pubkey,
          ByteData *annex)

{
  bool bVar1;
  bool bVar2;
  uint32_t uVar3;
  CfdException *this_00;
  reference this_01;
  undefined8 uVar4;
  undefined8 in_RCX;
  OutPoint *in_RDX;
  SchnorrSignature *in_RSI;
  UtxoData *in_RDI;
  SchnorrPubkey *in_R8;
  long in_R9;
  ByteData256 sighash;
  ByteData hash;
  Script locking_script;
  UtxoData *utxo;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *__range2;
  bool is_find;
  OutPoint target_outpoint;
  TxIn *txin_ref;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *__range1;
  vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> utxos;
  UtxoData target_utxo;
  UtxoData *in_stack_fffffffffffff7e8;
  undefined4 in_stack_fffffffffffff7f0;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffff7f4;
  Amount *in_stack_fffffffffffff7f8;
  string *in_stack_fffffffffffff800;
  string *message;
  undefined2 uVar6;
  CfdError in_stack_fffffffffffff80c;
  CfdError error_code;
  CfdException *in_stack_fffffffffffff810;
  size_type in_stack_fffffffffffff828;
  vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *in_stack_fffffffffffff830;
  allocator *paVar7;
  ByteData local_790;
  SchnorrSignature local_774;
  undefined1 local_74a;
  undefined1 local_749 [33];
  ByteData local_728;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> local_710;
  ByteData local_6f8;
  undefined1 local_6da;
  allocator local_6d9;
  string local_6d8 [38];
  undefined1 local_6b2;
  allocator local_6b1;
  string local_6b0 [38];
  undefined1 local_68a;
  allocator local_689;
  string local_688 [32];
  Script local_668;
  Txid local_630;
  reference local_610;
  UtxoData *local_608;
  __normal_iterator<const_cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
  local_600;
  undefined8 local_5f8;
  byte local_5e9;
  UtxoData *in_stack_fffffffffffffa18;
  OutPoint local_5c8;
  AbstractTxIn *local_5a0;
  __normal_iterator<const_cfd::core::TxIn_*,_std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>_>
  local_598;
  __normal_iterator<const_cfd::core::TxIn_*,_std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>_>
  local_590;
  ByteData *local_588;
  vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> local_570 [4];
  Script local_508 [9];
  Amount local_2f8 [44];
  long local_30;
  SchnorrPubkey *local_28;
  undefined8 local_20;
  OutPoint *local_18;
  SchnorrSignature *local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  UtxoData::UtxoData(in_RDI);
  std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::vector(local_570);
  std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::size
            ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
             &(in_RDI->block_hash).data_);
  std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::reserve
            (in_stack_fffffffffffff830,in_stack_fffffffffffff828);
  local_588 = &(in_RDI->block_hash).data_;
  local_590._M_current =
       (TxIn *)std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::begin
                         ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)local_588);
  local_598._M_current =
       (TxIn *)std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::end
                         ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)local_588);
  while (bVar1 = __gnu_cxx::operator!=(&local_590,&local_598), bVar1) {
    local_5a0 = &__gnu_cxx::
                 __normal_iterator<const_cfd::core::TxIn_*,_std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>_>
                 ::operator*(&local_590)->super_AbstractTxIn;
    core::AbstractTxIn::GetTxid((Txid *)&stack0xfffffffffffffa18,local_5a0);
    uVar3 = core::AbstractTxIn::GetVout(local_5a0);
    core::OutPoint::OutPoint(&local_5c8,(Txid *)&stack0xfffffffffffffa18,uVar3);
    core::Txid::~Txid((Txid *)0x53dcf6);
    local_5e9 = 0;
    local_5f8 = local_20;
    local_600._M_current =
         (UtxoData *)
         std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::begin
                   (in_stack_fffffffffffff7e8);
    local_608 = (UtxoData *)
                std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::end
                          ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)
                           in_stack_fffffffffffff7e8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
                               *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),
                              (__normal_iterator<const_cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
                               *)in_stack_fffffffffffff7e8), bVar1) {
      local_610 = __gnu_cxx::
                  __normal_iterator<const_cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
                  ::operator*(&local_600);
      core::AbstractTxIn::GetTxid(&local_630,local_5a0);
      bVar2 = core::Txid::Equals(&local_630,&local_610->txid);
      bVar1 = false;
      if (bVar2) {
        uVar3 = core::AbstractTxIn::GetVout(local_5a0);
        bVar1 = uVar3 == local_610->vout;
      }
      core::Txid::~Txid((Txid *)0x53ddf0);
      if (bVar1) {
        local_5e9 = 1;
        GetLockingScriptFromUtxoData(in_stack_fffffffffffffa18);
        std::vector<cfd::core::TxOut,std::allocator<cfd::core::TxOut>>::
        emplace_back<cfd::core::Amount_const&,cfd::core::Script&>
                  ((vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *)
                   in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,
                   (Script *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0));
        bVar1 = core::OutPoint::operator==(local_18,&local_5c8);
        if (bVar1) {
          UtxoData::operator=((UtxoData *)
                              CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),
                              in_stack_fffffffffffff7e8);
          core::Script::operator=(local_508,&local_668);
        }
        core::Script::~Script
                  ((Script *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0));
      }
      __gnu_cxx::
      __normal_iterator<const_cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
      ::operator++(&local_600);
    }
    if ((local_5e9 & 1) == 0) {
      local_68a = 1;
      uVar4 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_688,"Utxo is not found. VerifyInputSchnorrSignature fail.",&local_689);
      core::CfdException::CfdException
                (in_stack_fffffffffffff810,in_stack_fffffffffffff80c,in_stack_fffffffffffff800);
      local_68a = 0;
      __cxa_throw(uVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    core::OutPoint::~OutPoint((OutPoint *)0x53e05b);
    __gnu_cxx::
    __normal_iterator<const_cfd::core::TxIn_*,_std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>_>
    ::operator++(&local_590);
  }
  bVar1 = core::Amount::operator==(local_2f8,0);
  if (bVar1) {
    local_6b2 = 1;
    uVar4 = __cxa_allocate_exception(0x30);
    paVar7 = &local_6b1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_6b0,"OutPoint is not found into utxo_list.",paVar7);
    core::CfdException::CfdException
              (in_stack_fffffffffffff810,in_stack_fffffffffffff80c,in_stack_fffffffffffff800);
    local_6b2 = 0;
    __cxa_throw(uVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  bVar1 = core::Script::IsTaprootScript(local_508);
  if (bVar1) {
    core::Script::GetElementList(&local_710,local_508);
    uVar6 = (undefined2)in_stack_fffffffffffff80c;
    this_01 = std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
              operator[](&local_710,1);
    core::ScriptElement::GetBinaryData(&local_6f8,this_01);
    std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
              ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
               in_stack_fffffffffffff800);
    core::SchnorrPubkey::GetData(&local_728,local_28);
    bVar1 = core::ByteData::Equals(&local_6f8,&local_728);
    error_code = CONCAT13(bVar1,CONCAT12(bVar1,uVar6)) ^ 0xff0000;
    core::ByteData::~ByteData((ByteData *)0x53e319);
    if ((error_code & 0x10000) != kCfdSuccess) {
      local_74a = 1;
      uVar4 = __cxa_allocate_exception(0x30);
      message = (string *)local_749;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_749 + 1),"Unmatch locking script.",(allocator *)message);
      core::CfdException::CfdException(in_stack_fffffffffffff810,error_code,message);
      local_74a = 0;
      __cxa_throw(uVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    uVar3 = (**(code **)(in_RDI->block_height + 0x78))(in_RDI,local_18);
    core::SchnorrSignature::GetSigHashType(&local_774);
    if (local_30 == 0) {
      core::ByteData::ByteData(&local_790);
    }
    else {
      core::ByteData::ByteData
                ((ByteData *)CONCAT44(uVar3,in_stack_fffffffffffff7f0),
                 (ByteData *)in_stack_fffffffffffff7e8);
    }
    core::Transaction::GetSchnorrSignatureHash
              ((ByteData256 *)
               ((long)&local_774.data_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data + 0xc),(Transaction *)in_RDI,uVar3,
               (SigHashType *)&local_774,local_570,(TapScriptData *)0x0,&local_790);
    core::ByteData::~ByteData((ByteData *)0x53e51c);
    bVar1 = core::SchnorrPubkey::Verify
                      (local_28,local_10,
                       (ByteData256 *)
                       ((long)&local_774.data_.data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data + 0xc));
    uVar5 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff7f0);
    core::ByteData256::~ByteData256((ByteData256 *)0x53e54c);
    core::ByteData::~ByteData((ByteData *)0x53e559);
    std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::~vector
              ((vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *)
               in_stack_fffffffffffff800);
    UtxoData::~UtxoData((UtxoData *)CONCAT44(uVar3,uVar5));
    return (bool)((byte)((uint)uVar5 >> 0x18) & 1);
  }
  local_6da = 1;
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6d8,"Target OutPoint is not taproot.",&local_6d9);
  core::CfdException::CfdException(this_00,in_stack_fffffffffffff80c,in_stack_fffffffffffff800);
  local_6da = 0;
  __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

bool TransactionContext::VerifyInputSchnorrSignature(
    const SchnorrSignature& signature, const OutPoint& outpoint,
    const std::vector<UtxoData>& utxo_list, const SchnorrPubkey& pubkey,
    const ByteData* annex) const {
  UtxoData target_utxo;
  std::vector<TxOut> utxos;
  utxos.reserve(vin_.size());
  for (const auto& txin_ref : vin_) {
    OutPoint target_outpoint(txin_ref.GetTxid(), txin_ref.GetVout());
    bool is_find = false;
    for (const auto& utxo : utxo_list) {
      if (txin_ref.GetTxid().Equals(utxo.txid) &&
          (txin_ref.GetVout() == utxo.vout)) {
        is_find = true;
        Script locking_script = GetLockingScriptFromUtxoData(utxo);
        utxos.emplace_back(utxo.amount, locking_script);

        if (outpoint == target_outpoint) {
          target_utxo = utxo;
          target_utxo.locking_script = locking_script;
        }
      }
    }
    if (!is_find) {
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Utxo is not found. VerifyInputSchnorrSignature fail.");
    }
  }
  if (target_utxo.amount == 0) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "OutPoint is not found into utxo_list.");
  } else if (!target_utxo.locking_script.IsTaprootScript()) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Target OutPoint is not taproot.");
  }
  auto hash = target_utxo.locking_script.GetElementList()[1].GetBinaryData();
  if (!hash.Equals(pubkey.GetData())) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Unmatch locking script.");
  }

  auto sighash = GetSchnorrSignatureHash(
      GetTxInIndex(outpoint), signature.GetSigHashType(), utxos, nullptr,
      (annex != nullptr) ? *annex : ByteData());
  return pubkey.Verify(signature, sighash);
}